

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void HalfFloatRow_SSE2(uint16_t *src,uint16_t *dst,float scale,int width)

{
  bool bVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  undefined1 (*pauVar6) [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  fVar7 = scale * 1.92593e-34;
  pauVar6 = (undefined1 (*) [16])src;
  do {
    auVar9 = *pauVar6;
    auVar2._10_2_ = 0;
    auVar2._0_10_ = auVar9._0_10_;
    auVar2._12_2_ = auVar9._6_2_;
    auVar3._8_2_ = auVar9._4_2_;
    auVar3._0_8_ = auVar9._0_8_;
    auVar3._10_4_ = auVar2._10_4_;
    auVar4._6_8_ = 0;
    auVar4._0_6_ = auVar3._8_6_;
    auVar8._0_4_ = (uint)((float)auVar9._0_2_ * fVar7) >> 0xd;
    auVar8._4_4_ = (uint)((float)(int)CONCAT82(SUB148(auVar4 << 0x40,6),auVar9._2_2_) * fVar7) >>
                   0xd;
    auVar8._8_4_ = (uint)((float)auVar3._8_4_ * fVar7) >> 0xd;
    auVar8._12_4_ = (uint)((float)(auVar2._10_4_ >> 0x10) * fVar7) >> 0xd;
    auVar10._0_4_ = (uint)((float)auVar9._8_2_ * fVar7) >> 0xd;
    auVar10._4_4_ = (uint)((float)auVar9._10_2_ * fVar7) >> 0xd;
    auVar10._8_4_ = (uint)((float)auVar9._12_2_ * fVar7) >> 0xd;
    auVar10._12_4_ = (uint)((float)auVar9._14_2_ * fVar7) >> 0xd;
    auVar9 = packssdw(auVar8,auVar10);
    *(undefined1 (*) [16])((long)pauVar6 + ((long)dst - (long)src)) = auVar9;
    iVar5 = width + -8;
    bVar1 = 7 < width;
    pauVar6 = pauVar6 + 1;
    width = iVar5;
  } while (iVar5 != 0 && bVar1);
  return;
}

Assistant:

void HalfFloatRow_SSE2(const uint16_t* src,
                       uint16_t* dst,
                       float scale,
                       int width) {
  scale *= kScaleBias;
  asm volatile(
      "movd        %3,%%xmm4                     \n"
      "pshufd      $0x0,%%xmm4,%%xmm4            \n"
      "pxor        %%xmm5,%%xmm5                 \n"
      "sub         %0,%1                         \n"

      // 16 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm2                   \n"  // 8 shorts
      "add         $0x10,%0                      \n"
      "movdqa      %%xmm2,%%xmm3                 \n"
      "punpcklwd   %%xmm5,%%xmm2                 \n"  // 8 ints in xmm2/1
      "cvtdq2ps    %%xmm2,%%xmm2                 \n"  // 8 floats
      "punpckhwd   %%xmm5,%%xmm3                 \n"
      "cvtdq2ps    %%xmm3,%%xmm3                 \n"
      "mulps       %%xmm4,%%xmm2                 \n"
      "mulps       %%xmm4,%%xmm3                 \n"
      "psrld       $0xd,%%xmm2                   \n"
      "psrld       $0xd,%%xmm3                   \n"
      "packssdw    %%xmm3,%%xmm2                 \n"
      "movdqu      %%xmm2,-0x10(%0,%1,1)         \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      : "m"(scale)   // %3
      : "memory", "cc", "xmm2", "xmm3", "xmm4", "xmm5");
}